

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O1

void __thiscall
re2c::SwitchIf::used_labels
          (SwitchIf *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  if (this->type == IF) {
    If::used_labels((this->info).ifs,used);
    return;
  }
  if (this->type == SWITCH) {
    Cases::used_labels((this->info).cases,used);
    return;
  }
  return;
}

Assistant:

void SwitchIf::used_labels (std::set<label_t> & used)
{
	switch (type)
	{
		case SWITCH:
			info.cases->used_labels (used);
			break;
		case IF:
			info.ifs->used_labels (used);
			break;
	}
}